

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall rengine::TransformNode::setMatrix_rotateAroundZ(TransformNode *this,float radians)

{
  float fVar1;
  float fVar2;
  
  fVar1 = sinf(radians);
  fVar2 = cosf(radians);
  *(float *)&(this->super_Node).field_0x34 = fVar2;
  *(float *)&this->field_0x38 = -fVar1;
  *(undefined8 *)&this->field_0x3c = 0;
  *(float *)&this->field_0x44 = fVar1;
  *(float *)&this->field_0x48 = fVar2;
  *(undefined8 *)&this->field_0x4c = 0;
  *(undefined8 *)&this->field_0x54 = 0;
  *(undefined4 *)&this->field_0x5c = 0x3f800000;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x68 = 0;
  *(undefined8 *)&this->field_0x70 = 0x43f800000;
  return;
}

Assistant:

void setMatrix_rotateAroundZ(float radians) { setMatrix(mat4::rotateAroundZ(radians)); }